

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O0

MPP_RET mpp_buf_slot_enqueue(MppBufSlots slots,RK_S32 index,SlotQueueType type)

{
  MppBufSlotEntry *slot_00;
  MppBufSlotEntry *slot;
  AutoMutex auto_lock;
  MppBufSlotsImpl *impl;
  SlotQueueType type_local;
  RK_S32 index_local;
  MppBufSlots slots_local;
  
  if (slots == (MppBufSlots)0x0) {
    _mpp_log_l(2,"mpp_buf_slot","found NULL input\n","mpp_buf_slot_enqueue");
    slots_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    auto_lock.mLock = (Mutex *)slots;
    Mutex::Autolock::Autolock((Autolock *)&slot,*slots,1);
    if ((index < 0) || (auto_lock.mLock[2].mMutex.__data.__kind <= index)) {
      _dump_slots("mpp_buf_slot_enqueue",(MppBufSlotsImpl *)auto_lock.mLock);
      _mpp_log_l(2,"mpp_buf_slot","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "(index >= 0) && (index < impl->buf_count)","mpp_buf_slot_enqueue",0x43d);
      abort();
    }
    slot_00 = (MppBufSlotEntry *)
              ((long)auto_lock.mLock[5].mMutex.__data.__list.__next + (long)index * 0x38);
    slot_ops_with_log((MppBufSlotsImpl *)auto_lock.mLock,slot_00,type + 0xf,(void *)0x0);
    list_del_init(&slot_00->list);
    list_add_tail(&slot_00->list,
                  (list_head *)((long)&auto_lock.mLock[4].mMutex + (ulong)type * 0x10));
    slots_local._4_4_ = MPP_OK;
    Mutex::Autolock::~Autolock((Autolock *)&slot);
  }
  return slots_local._4_4_;
}

Assistant:

MPP_RET mpp_buf_slot_enqueue(MppBufSlots slots, RK_S32 index, SlotQueueType type)
{
    if (NULL == slots) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppBufSlotsImpl *impl = (MppBufSlotsImpl *)slots;
    AutoMutex auto_lock(impl->lock);
    slot_assert(impl, (index >= 0) && (index < impl->buf_count));
    MppBufSlotEntry *slot = &impl->slots[index];
    slot_ops_with_log(impl, slot, (MppBufSlotOps)(SLOT_ENQUEUE + type), NULL);

    // add slot to display list
    list_del_init(&slot->list);
    list_add_tail(&slot->list, &impl->queue[type]);
    return MPP_OK;
}